

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteTranslational::ChLinkRevoluteTranslational(ChLinkRevoluteTranslational *this)

{
  undefined1 auVar1 [32];
  
  ChLink::ChLink(&this->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkRevoluteTranslational_00b1d9c8;
  (this->m_p1).m_data[0] = 0.0;
  (this->m_p1).m_data[1] = 0.0;
  (this->m_p1).m_data[2] = 0.0;
  (this->m_p2).m_data[0] = 0.0;
  (this->m_p2).m_data[1] = 0.0;
  (this->m_p2).m_data[2] = 0.0;
  (this->m_z1).m_data[0] = 0.0;
  (this->m_z1).m_data[1] = 0.0;
  (this->m_z1).m_data[2] = 1.0;
  (this->m_x2).m_data[0] = 1.0;
  (this->m_y2).m_data[0] = 0.0;
  (this->m_x2).m_data[1] = 0.0;
  (this->m_x2).m_data[2] = 0.0;
  (this->m_y2).m_data[1] = 1.0;
  auVar1 = ZEXT832(0) << 0x20;
  *(undefined1 (*) [32])((this->m_y2).m_data + 2) = auVar1;
  this->m_cur_par1 = (double)auVar1._0_8_;
  this->m_cur_par2 = (double)auVar1._8_8_;
  this->m_cur_dot = (double)auVar1._16_8_;
  this->m_cur_dist = (double)auVar1._24_8_;
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_par1);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_par2);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dot);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dist);
  this->m_multipliers[0] = 0.0;
  this->m_multipliers[1] = 0.0;
  this->m_multipliers[2] = 0.0;
  this->m_multipliers[3] = 0.0;
  return;
}

Assistant:

ChLinkRevoluteTranslational::ChLinkRevoluteTranslational()
    : m_p1(ChVector<>(0, 0, 0)),
      m_p2(ChVector<>(0, 0, 0)),
      m_z1(ChVector<>(0, 0, 1)),
      m_x2(ChVector<>(1, 0, 0)),
      m_y2(ChVector<>(0, 1, 0)),
      m_dist(0),
      m_cur_par1(0),
      m_cur_par2(0),
      m_cur_dot(0),
      m_cur_dist(0) {
    for (int i = 0; i < 4; i++) {
        m_multipliers[i] = 0;
    }
}